

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O0

lzma_ret lzma_block_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_block *block)

{
  lzma_bool lVar1;
  lzma_next_coder *__dest;
  undefined1 local_78 [8];
  undefined8 local_70;
  lzma_next_coder *local_30;
  lzma_block_coder_conflict *coder;
  lzma_block *block_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder = (lzma_block_coder_conflict *)block;
  block_local = (lzma_block *)allocator;
  allocator_local = (lzma_allocator *)next;
  if ((code *)next->init != lzma_block_encoder_init) {
    lzma_next_end(next,allocator);
  }
  allocator_local->opaque = lzma_block_encoder_init;
  if (coder == (lzma_block_coder_conflict *)0x0) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else if (*(uint *)&(coder->next).coder < 2) {
    if ((uint)(coder->next).id < 0x10) {
      lVar1 = lzma_check_is_supported((lzma_check)(coder->next).id);
      if (lVar1 == '\0') {
        next_local._4_4_ = LZMA_UNSUPPORTED_CHECK;
      }
      else {
        local_30 = (lzma_next_coder *)allocator_local->alloc;
        if (local_30 == (lzma_next_coder *)0x0) {
          __dest = (lzma_next_coder *)lzma_alloc(0xd8,(lzma_allocator *)block_local);
          if (__dest == (lzma_next_coder *)0x0) {
            return LZMA_MEM_ERROR;
          }
          allocator_local->alloc = (_func_void_ptr_void_ptr_size_t_size_t *)__dest;
          allocator_local[1].alloc = block_encode;
          allocator_local[1].free = block_encoder_end;
          allocator_local[2].opaque = block_encoder_update;
          local_30 = __dest;
          memset(local_78,0,0x48);
          local_70 = 0xffffffffffffffff;
          memcpy(__dest,local_78,0x48);
        }
        *(undefined4 *)&local_30[1].id = 0;
        local_30[1].coder = coder;
        local_30[1].init = 0;
        local_30[1].code = (lzma_code_function)0x0;
        local_30[1].end = (lzma_end_function)0x0;
        lzma_check_init((lzma_check_state *)&local_30[1].get_progress,(lzma_check)(coder->next).id);
        next_local._4_4_ =
             lzma_raw_encoder_init
                       (local_30,(lzma_allocator *)block_local,(lzma_filter *)(coder->next).end);
      }
    }
    else {
      next_local._4_4_ = LZMA_PROG_ERROR;
    }
  }
  else {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_block_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_encoder_init, next, allocator);

	if (block == NULL)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version first.
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	// If the Check ID is not supported, we cannot calculate the check and
	// thus not create a proper Block.
	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Allocate and initialize *next->coder if needed.
	lzma_block_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_block_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &block_encode;
		next->end = &block_encoder_end;
		next->update = &block_encoder_update;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	coder->sequence = SEQ_CODE;
	coder->block = block;
	coder->compressed_size = 0;
	coder->uncompressed_size = 0;
	coder->pos = 0;

	// Initialize the check
	lzma_check_init(&coder->check, block->check);

	// Initialize the requested filters.
	return lzma_raw_encoder_init(&coder->next, allocator, block->filters);
}